

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

OneofOptions *
google::protobuf::Arena::CreateMessageInternal<google::protobuf::OneofOptions>(Arena *arena)

{
  OneofOptions *pOVar1;
  
  if (arena != (Arena *)0x0) {
    pOVar1 = DoCreateMessage<google::protobuf::OneofOptions>(arena);
    return pOVar1;
  }
  pOVar1 = (OneofOptions *)operator_new(0x48);
  OneofOptions::OneofOptions(pOVar1,(Arena *)0x0,false);
  return pOVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }